

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BackwardPass.cpp
# Opt level: O3

void __thiscall BackwardPass::RemoveEmptyLoops(BackwardPass *this)

{
  Loop *pLVar1;
  JitArenaAllocator *this_00;
  BVSparseNode *this_01;
  BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_02;
  BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
  *this_03;
  Loop *loop;
  bool bVar2;
  uint sourceContextId;
  uint functionId;
  JITTimeFunctionBody *this_04;
  FunctionJITTimeInfo *this_05;
  MemOpInfo *buffer;
  
  this_04 = JITTimeWorkItem::GetJITFunctionBody(this->func->m_workItem);
  sourceContextId = JITTimeFunctionBody::GetSourceContextId(this_04);
  this_05 = JITTimeWorkItem::GetJITTimeInfo(this->func->m_workItem);
  functionId = FunctionJITTimeInfo::GetLocalFunctionId(this_05);
  bVar2 = Js::Phases::IsEnabled((Phases *)&DAT_015a4e90,MemOpPhase,sourceContextId,functionId);
  if (!bVar2) {
    pLVar1 = this->func->m_fg->loopList;
    while (loop = pLVar1, loop != (Loop *)0x0) {
      pLVar1 = loop->next;
      bVar2 = IsEmptyLoopAfterMemOp(this,loop);
      if (bVar2) {
        RestoreInductionVariableValuesAfterMemOp(this,loop);
        RemoveEmptyLoopAfterMemOp(this,loop);
      }
      buffer = loop->memOpInfo;
      if (buffer != (MemOpInfo *)0x0) {
        this_00 = this->func->topFunc->m_fg->alloc;
        if (&buffer->candidates->
             super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> !=
            (SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)0x0) {
          SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::Clear
                    (&buffer->candidates->
                      super_SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>);
          this_01 = (BVSparseNode *)loop->memOpInfo->candidates;
          SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount>::~SList
                    ((SList<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)this_01);
          (((SListBase<Loop::MemOpCandidate_*,_Memory::ArenaAllocator,_RealCount> *)&this_01->next)
          ->super_SListNodeBase<Memory::ArenaAllocator>).next = (Type)this_00->bvFreeList;
          this_00->bvFreeList = this_01;
          buffer = loop->memOpInfo;
        }
        if (buffer->inductionVariableChangeInfoMap !=
            (BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)0x0) {
          JsUtil::
          BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Clear(buffer->inductionVariableChangeInfoMap);
          this_02 = loop->memOpInfo->inductionVariableChangeInfoMap;
          JsUtil::
          BaseDictionary<unsigned_int,_Loop::InductionVariableChangeInfo,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::~BaseDictionary(this_02);
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                     this_02,0x38);
          buffer = loop->memOpInfo;
        }
        if (buffer->inductionVariableOpndPerUnrollMap !=
            (BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
             *)0x0) {
          JsUtil::
          BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::Clear(buffer->inductionVariableOpndPerUnrollMap);
          this_03 = loop->memOpInfo->inductionVariableOpndPerUnrollMap;
          JsUtil::
          BaseDictionary<unsigned_char,_IR::Opnd_*,_Memory::JitArenaAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::~BaseDictionary(this_03);
          Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                    ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                     this_03,0x38);
          buffer = loop->memOpInfo;
        }
        if (buffer->inductionVariablesUsedAfterLoop != (BVSparse<Memory::JitArenaAllocator> *)0x0) {
          Memory::
          DeleteObject<Memory::JitArenaAllocator,(Memory::AllocatorDeleteFlags)0,BVSparse<Memory::JitArenaAllocator>>
                    (this->tempAlloc,buffer->inductionVariablesUsedAfterLoop);
          buffer = loop->memOpInfo;
        }
        Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::Free
                  ((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)this_00,
                   buffer,0x48);
      }
    }
  }
  return;
}

Assistant:

void
BackwardPass::RemoveEmptyLoops()
{
    if (PHASE_OFF(Js::MemOpPhase, this->func))
    {
        return;

    }
    const auto DeleteMemOpInfo = [&](Loop *loop)
    {
        JitArenaAllocator *alloc = this->func->GetTopFunc()->m_fg->alloc;

        if (!loop->memOpInfo)
        {
            return;
        }

        if (loop->memOpInfo->candidates)
        {
            loop->memOpInfo->candidates->Clear();
            JitAdelete(alloc, loop->memOpInfo->candidates);
        }

        if (loop->memOpInfo->inductionVariableChangeInfoMap)
        {
            loop->memOpInfo->inductionVariableChangeInfoMap->Clear();
            JitAdelete(alloc, loop->memOpInfo->inductionVariableChangeInfoMap);
        }

        if (loop->memOpInfo->inductionVariableOpndPerUnrollMap)
        {
            loop->memOpInfo->inductionVariableOpndPerUnrollMap->Clear();
            JitAdelete(alloc, loop->memOpInfo->inductionVariableOpndPerUnrollMap);
        }

        if (loop->memOpInfo->inductionVariablesUsedAfterLoop)
        {
            JitAdelete(this->tempAlloc, loop->memOpInfo->inductionVariablesUsedAfterLoop);
        }
        JitAdelete(alloc, loop->memOpInfo);
    };

    FOREACH_LOOP_IN_FUNC_EDITING(loop, this->func)
    {
        if (IsEmptyLoopAfterMemOp(loop))
        {
            RestoreInductionVariableValuesAfterMemOp(loop);
            RemoveEmptyLoopAfterMemOp(loop);
        }
        // Remove memop info as we don't need them after this point.
        DeleteMemOpInfo(loop);

    } NEXT_LOOP_IN_FUNC_EDITING;

}